

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::StringOutputStream::Next(StringOutputStream *this,void **data,int *size)

{
  pointer pcVar1;
  int iVar2;
  
  iVar2 = (int)this->target_->_M_string_length;
  std::__cxx11::string::resize((ulong)this->target_);
  if (this->target_->_M_string_length == 0) {
    pcVar1 = (pointer)0x0;
  }
  else {
    pcVar1 = (this->target_->_M_dataplus)._M_p;
  }
  *data = pcVar1 + iVar2;
  *size = (int)this->target_->_M_string_length - iVar2;
  return true;
}

Assistant:

bool StringOutputStream::Next(void** data, int* size) {
  int old_size = target_->size();

  // Grow the string.
  if (old_size < target_->capacity()) {
    // Resize the string to match its capacity, since we can get away
    // without a memory allocation this way.
    STLStringResizeUninitialized(target_, target_->capacity());
  } else {
    // Size has reached capacity, so double the size.  Also make sure
    // that the new size is at least kMinimumSize.
    STLStringResizeUninitialized(
      target_,
      max(old_size * 2,
          kMinimumSize + 0));  // "+ 0" works around GCC4 weirdness.
  }

  *data = string_as_array(target_) + old_size;
  *size = target_->size() - old_size;
  return true;
}